

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

int cmphstr(char **p1,char *p2,bool allowParenthesisEnd)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  
  bVar5 = *p2;
  pcVar2 = *p1;
  if (bVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      iVar3 = isalpha((uint)bVar5);
      if (iVar3 != 0) break;
      if (pcVar2[uVar4] != bVar5) {
        return 0;
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      bVar5 = p2[uVar4];
    } while (bVar5 != 0);
  }
  iVar3 = isupper((uint)(byte)pcVar2[uVar4]);
  uVar6 = (uint)uVar4;
  bVar5 = p2[uVar4];
  if (iVar3 == 0) {
    while (bVar5 != 0) {
      if (pcVar2[uVar4] != bVar5) {
        return 0;
      }
      uVar6 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar6;
      bVar5 = p2[uVar4];
    }
  }
  else {
    while (bVar5 != 0) {
      cVar1 = pcVar2[uVar4];
      iVar3 = toupper((uint)bVar5);
      if (iVar3 != cVar1) {
        return 0;
      }
      uVar6 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar6;
      bVar5 = p2[uVar4];
    }
  }
  bVar5 = pcVar2[uVar4];
  if ((0x20 < bVar5) && (bVar5 != 0x3b)) {
    if (bVar5 == 0x2f) {
      if ((pcVar2[uVar6 + 1] != '*') && (pcVar2[uVar6 + 1] != '/')) {
        return 0;
      }
    }
    else if (!allowParenthesisEnd || bVar5 != 0x28) {
      return 0;
    }
  }
  *p1 = pcVar2 + uVar4;
  return 1;
}

Assistant:

int cmphstr(char*& p1, const char* p2, bool allowParenthesisEnd) {
	unsigned int i = 0;
	// check initial non-alpha chars without deciding the upper/lower case of test
	while (p2[i] && !isalpha((byte)p2[i])) {
		if (p1[i] != p2[i]) return 0;
		++i;
	}
	// now the first alpha char will make whole test upper or lower case like.
	if (isupper((byte)p1[i])) {
		while (p2[i]) {
			if (p1[i] != toupper((byte)p2[i])) return 0;
			++i;
		}
	} else {
		while (p2[i]) {
			if (p1[i] != p2[i]) return 0;
			++i;
		}
	}
	if (p1[i]) {		// there is some character after the first word
		// whitespace, EOL-comment and block-comment-start keep the match valid
		// also starting parenthesis when allowParenthesisEnd
		if (
			!White(p1[i]) && \
			!(';' == p1[i]) && \
			!('/' == p1[i] && '/' == p1[i+1]) && \
			!('/' == p1[i] && '*' == p1[i+1]) && \
			!(allowParenthesisEnd && '(' == p1[i])
		) {
			return 0;	// anything else invalidates the found match
		}
	}
	// space, tab, enter, \0, ... => "match"
	p1 += i;
	return 1;
}